

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilBridge.c
# Opt level: O1

void Gia_ManToBridgeAbsNetlistTest(char *pFileName,Gia_Man_t *p,int msg_type)

{
  FILE *__stream;
  
  __stream = fopen(pFileName,"wb");
  if (__stream != (FILE *)0x0) {
    Gia_ManToBridgeAbsNetlist((FILE *)__stream,p,msg_type);
    fclose(__stream);
    return;
  }
  printf("Cannot open output file \"%s\".\n",pFileName);
  return;
}

Assistant:

void Gia_ManToBridgeAbsNetlistTest( char * pFileName, Gia_Man_t * p, int msg_type )
{
    FILE * pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open output file \"%s\".\n", pFileName );
        return;
    }
    Gia_ManToBridgeAbsNetlist( pFile, p, msg_type );
    fclose ( pFile );
}